

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::
Global_Decl_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval_internal
          (Global_Decl_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
           *this,Dispatch_State *t_ss)

{
  Boxed_Value *obj;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long lVar2;
  Boxed_Value BVar3;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long local_30 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  lVar2 = ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align;
  if (*(int *)(lVar2 + 8) == 0x22) {
    lVar2 = **(long **)(lVar2 + 0x50);
  }
  obj = (Boxed_Value *)*in_RDX;
  local_50._8_8_ = operator_new(0x50);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_003c4838;
  local_50._0_8_ = local_50._8_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._8_8_ + 0x10))->_vptr__Sp_counted_base
       = (_func_int **)&Type_Info::Unknown_Type::typeinfo;
  *(pointer_____offset_0x10___ **)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._8_8_ + 0x10))->_M_use_count =
       &Type_Info::Unknown_Type::typeinfo;
  *(undefined4 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._8_8_ + 0x20))->
    _vptr__Sp_counted_base = 0x20;
  *(undefined8 *)
   ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._8_8_ + 0x20))->
           _vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._8_8_ + 0x20))->_M_weak_count = 0;
  *(undefined8 *)
   ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._8_8_ + 0x30))->
           _vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._8_8_ + 0x30))->_M_weak_count = 0;
  *(undefined8 *)
   ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._8_8_ + 0x40))->
           _vptr__Sp_counted_base + 2) = 0;
  local_40._M_allocated_capacity = (size_type)local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_50 + 0x10),*(long *)(lVar2 + 0x10),
             *(long *)(lVar2 + 0x18) + *(long *)(lVar2 + 0x10));
  BVar3 = chaiscript::detail::Dispatch_Engine::add_global_no_throw
                    ((Dispatch_Engine *)this,obj,(string *)local_50);
  _Var1._M_pi = BVar3.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if ((long *)local_40._M_allocated_capacity != local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30[0] + 1);
    _Var1._M_pi = extraout_RDX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
    _Var1._M_pi = extraout_RDX_00;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        const std::string &idname = (this->children[0]->identifier == AST_Node_Type::Reference) ? this->children[0]->children[0]->text : this->children[0]->text;

        return t_ss->add_global_no_throw(Boxed_Value(), idname);
      }